

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::ReadKSZ8851DMA(FpgaIO *this,uint16_t *rdata)

{
  bool bVar1;
  uint32_t uVar2;
  uint local_28;
  uint local_24;
  quadlet_t read_data;
  quadlet_t write_data;
  uint16_t *rdata_local;
  FpgaIO *this_local;
  
  _read_data = rdata;
  rdata_local = (uint16_t *)this;
  uVar2 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  if (uVar2 < 5) {
    this_local._7_1_ = false;
  }
  else {
    local_24 = *_read_data | 0x9000000;
    bVar1 = WriteEthernetControl(this,local_24);
    if (bVar1) {
      bVar1 = ReadEthernetStatus(this,&local_28);
      if (bVar1) {
        if ((local_28 & 0x80000000) == 0) {
          this_local._7_1_ = false;
        }
        else if ((local_28 & 0x40000000) == 0) {
          *_read_data = (ushort)local_28;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::ReadKSZ8851DMA(uint16_t &rdata)
{
    if (GetFirmwareVersion() < 5) return false;
    quadlet_t write_data = ETH_CTRL_DMA_V2 | ETH_CTRL_WB_V2 | rdata;
    if (!WriteEthernetControl(write_data))
        return false;
    quadlet_t read_data;
    if (!ReadEthernetStatus(read_data))
        return false;
    // Check if Ethernet is present
    if (!(read_data&ETH_STAT_PRESENT_V2)) return false;
    // Check if last command had an error
    if (read_data&ETH_STAT_REQ_ERR_V2) return false;
    rdata = static_cast<uint16_t>(read_data);
    return true;
}